

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

bool __thiscall
SQClass::NewSlot(SQClass *this,SQSharedState *ss,SQObjectPtr *key,SQObjectPtr *val,bool bstatic)

{
  bool bVar1;
  SQInteger SVar2;
  SQObjectPtr *val_00;
  SQClassMember *pSVar3;
  SQObjectPtr *in_RCX;
  SQClassMember *in_RDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  SQClassMember m;
  SQClassMember m_1;
  bool isconstructor;
  SQObjectPtr theval;
  SQInteger mmidx;
  bool belongs_to_static_table;
  SQObjectPtr temp;
  SQClassMember *in_stack_fffffffffffffeb0;
  SQClosure *in_stack_fffffffffffffeb8;
  SQClassMember *in_stack_fffffffffffffec0;
  SQObjectPtr *in_stack_fffffffffffffec8;
  SQClosure *in_stack_fffffffffffffed0;
  SQTable *in_stack_fffffffffffffed8;
  SQObjectPtr *in_stack_fffffffffffffee0;
  SQSharedState *in_stack_fffffffffffffee8;
  byte local_d9;
  SQObjectPtr local_d8 [3];
  SQObjectPtr local_a8 [3];
  bool local_71;
  SQObjectPtr local_70;
  SQInteger local_60;
  undefined4 local_48;
  byte local_41;
  SQObjectPtr local_40;
  byte local_29;
  SQObjectPtr *local_28;
  SQClassMember *local_20;
  long local_18;
  byte local_1;
  
  local_29 = in_R8B & 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  ::SQObjectPtr::SQObjectPtr(&local_40);
  local_d9 = 1;
  if (((local_28->super_SQObject)._type != OT_CLOSURE) &&
     (local_d9 = 1, (local_28->super_SQObject)._type != OT_NATIVECLOSURE)) {
    local_d9 = local_29;
  }
  local_41 = local_d9 & 1;
  if (((*(byte *)(in_RDI + 0x1b0) & 1) == 0) || (local_41 != 0)) {
    bVar1 = SQTable::Get(in_stack_fffffffffffffed8,(SQObjectPtr *)in_stack_fffffffffffffed0,
                         in_stack_fffffffffffffec8);
    if ((bVar1) && ((local_40.super_SQObject._unVal.nInteger & 0x2000000U) != 0)) {
      sqvector<SQClassMember>::operator[]
                ((sqvector<SQClassMember> *)(in_RDI + 0x40),
                 (ulong)((uint)local_40.super_SQObject._unVal.fFloat & 0xffffff));
      ::SQObjectPtr::operator=
                (&in_stack_fffffffffffffec0->val,(SQObjectPtr *)in_stack_fffffffffffffeb8);
      local_1 = 1;
      local_48 = 1;
    }
    else {
      SVar2 = SQTable::CountUsed(*(SQTable **)(in_RDI + 0x30));
      if (SVar2 < 0xffffff) {
        if ((local_41 & 1) == 0) {
          SQClassMember::SQClassMember(in_stack_fffffffffffffec0);
          ::SQObjectPtr::operator=
                    (&in_stack_fffffffffffffec0->val,(SQObjectPtr *)in_stack_fffffffffffffeb8);
          pSVar3 = (SQClassMember *)
                   sqvector<SQClassMember>::size((sqvector<SQClassMember> *)(in_RDI + 0x40));
          ::SQObjectPtr::SQObjectPtr(local_d8,(ulong)pSVar3 | 0x2000000);
          SQTable::NewSlot((SQTable *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                           (SQObjectPtr *)in_stack_fffffffffffffed8);
          ::SQObjectPtr::~SQObjectPtr(&local_20->val);
          sqvector<SQClassMember>::push_back
                    ((sqvector<SQClassMember> *)in_stack_fffffffffffffec0,pSVar3);
          local_1 = 1;
          local_48 = 1;
          SQClassMember::~SQClassMember(local_20);
          in_stack_fffffffffffffeb0 = local_20;
        }
        else {
          if ((((local_28->super_SQObject)._type == OT_CLOSURE) ||
              ((local_28->super_SQObject)._type == OT_NATIVECLOSURE)) &&
             (local_60 = SQSharedState::GetMetaMethodIdxByName
                                   (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0),
             local_60 != -1)) {
            ::SQObjectPtr::operator=
                      (&in_stack_fffffffffffffec0->val,(SQObjectPtr *)in_stack_fffffffffffffeb8);
          }
          else {
            ::SQObjectPtr::SQObjectPtr(&local_70,local_28);
            if ((*(long *)(in_RDI + 0x38) != 0) && ((local_28->super_SQObject)._type == OT_CLOSURE))
            {
              in_stack_fffffffffffffee8 =
                   (SQSharedState *)SQClosure::Clone(in_stack_fffffffffffffed0);
              ::SQObjectPtr::operator=(&in_stack_fffffffffffffec0->val,in_stack_fffffffffffffeb8);
              (local_70.super_SQObject._unVal.pTable)->_nodes = *(_HashNode **)(in_RDI + 0x38);
              *(long *)(*(long *)(in_RDI + 0x38) + 8) = *(long *)(*(long *)(in_RDI + 0x38) + 8) + 1;
            }
            if (local_40.super_SQObject._type == OT_NULL) {
              SQVM::IsEqual((SQObjectPtr *)(local_18 + 0x78),&local_20->val,&local_71);
              if ((local_71 & 1U) != 0) {
                in_stack_fffffffffffffee0 =
                     (SQObjectPtr *)
                     sqvector<SQClassMember>::size((sqvector<SQClassMember> *)(in_RDI + 0x58));
                *(SQObjectPtr **)(in_RDI + 0x1b8) = in_stack_fffffffffffffee0;
              }
              SQClassMember::SQClassMember(in_stack_fffffffffffffec0);
              ::SQObjectPtr::operator=
                        (&in_stack_fffffffffffffec0->val,(SQObjectPtr *)in_stack_fffffffffffffeb8);
              val_00 = (SQObjectPtr *)
                       sqvector<SQClassMember>::size((sqvector<SQClassMember> *)(in_RDI + 0x58));
              ::SQObjectPtr::SQObjectPtr(local_a8,(ulong)val_00 | 0x1000000);
              SQTable::NewSlot((SQTable *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,val_00
                              );
              ::SQObjectPtr::~SQObjectPtr(&in_stack_fffffffffffffeb0->val);
              sqvector<SQClassMember>::push_back
                        ((sqvector<SQClassMember> *)in_stack_fffffffffffffec0,
                         (SQClassMember *)in_stack_fffffffffffffeb8);
              SQClassMember::~SQClassMember(in_stack_fffffffffffffeb0);
            }
            else {
              pSVar3 = sqvector<SQClassMember>::operator[]
                                 ((sqvector<SQClassMember> *)(in_RDI + 0x58),
                                  (ulong)((uint)local_40.super_SQObject._unVal.fFloat & 0xffffff));
              ::SQObjectPtr::operator=(&pSVar3->val,(SQObjectPtr *)in_stack_fffffffffffffeb8);
            }
            ::SQObjectPtr::~SQObjectPtr(&in_stack_fffffffffffffeb0->val);
          }
          local_1 = 1;
          local_48 = 1;
        }
      }
      else {
        local_1 = 0;
        local_48 = 1;
      }
    }
  }
  else {
    local_1 = 0;
    local_48 = 1;
  }
  ::SQObjectPtr::~SQObjectPtr(&in_stack_fffffffffffffeb0->val);
  return (bool)(local_1 & 1);
}

Assistant:

bool SQClass::NewSlot(SQSharedState *ss,const SQObjectPtr &key,const SQObjectPtr &val,bool bstatic)
{
    SQObjectPtr temp;
    bool belongs_to_static_table = sq_type(val) == OT_CLOSURE || sq_type(val) == OT_NATIVECLOSURE || bstatic;
    if(_locked && !belongs_to_static_table)
        return false; //the class already has an instance so cannot be modified
    if(_members->Get(key,temp) && _isfield(temp)) //overrides the default value
    {
        _defaultvalues[_member_idx(temp)].val = val;
        return true;
    }
	if (_members->CountUsed() >= MEMBER_MAX_COUNT) {
		return false;
	}
    if(belongs_to_static_table) {
        SQInteger mmidx;
        if((sq_type(val) == OT_CLOSURE || sq_type(val) == OT_NATIVECLOSURE) &&
            (mmidx = ss->GetMetaMethodIdxByName(key)) != -1) {
            _metamethods[mmidx] = val;
        }
        else {
            SQObjectPtr theval = val;
            if(_base && sq_type(val) == OT_CLOSURE) {
                theval = _closure(val)->Clone();
                _closure(theval)->_base = _base;
                __ObjAddRef(_base); //ref for the closure
            }
            if(sq_type(temp) == OT_NULL) {
                bool isconstructor;
                SQVM::IsEqual(ss->_constructoridx, key, isconstructor);
                if(isconstructor) {
                    _constructoridx = (SQInteger)_methods.size();
                }
                SQClassMember m;
                m.val = theval;
                _members->NewSlot(key,SQObjectPtr(_make_method_idx(_methods.size())));
                _methods.push_back(m);
            }
            else {
                _methods[_member_idx(temp)].val = theval;
            }
        }
        return true;
    }
    SQClassMember m;
    m.val = val;
    _members->NewSlot(key,SQObjectPtr(_make_field_idx(_defaultvalues.size())));
    _defaultvalues.push_back(m);
    return true;
}